

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::MarkTemp(BackwardPass *this,StackSym *sym)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  TempObjectTracker *this_00;
  TempObjectVerifyTracker *this_01;
  
  if (this->isCollectionPass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x190f,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar3) goto LAB_003d43d2;
    *puVar4 = 0;
  }
  if (sym->m_type == TyVar) {
    pBVar1 = this->currentBlock;
    bVar3 = DoMarkTempObjects(this);
    if (bVar3) {
      this_00 = pBVar1->tempObjectTracker;
      if ((pBVar1->loop == (Loop *)0x0) ==
          ((this_00->super_ObjectTemp).super_TempTrackerBase.tempTransferDependencies !=
          (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x191e,
                           "((block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies())"
                           ,
                           "(block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies()"
                          );
        if (!bVar3) goto LAB_003d43d2;
        *puVar4 = 0;
        this_00 = pBVar1->tempObjectTracker;
      }
      TempTracker<ObjectTemp>::MarkTemp(this_00,sym,this);
    }
    bVar3 = DoMarkTempObjectVerify(this);
    if (bVar3) {
      this_01 = pBVar1->tempObjectVerifyTracker;
      if ((pBVar1->loop == (Loop *)0x0) ==
          ((this_01->super_ObjectTempVerify).super_TempTrackerBase.tempTransferDependencies !=
          (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1924,
                           "((block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies())"
                           ,
                           "(block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies()"
                          );
        if (!bVar3) {
LAB_003d43d2:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
        this_01 = pBVar1->tempObjectVerifyTracker;
      }
      TempTracker<ObjectTempVerify>::MarkTemp(this_01,sym,this);
      return;
    }
  }
  return;
}

Assistant:

void
BackwardPass::MarkTemp(StackSym * sym)
{
    Assert(!IsCollectionPass());
    // Don't care about type specialized syms
    if (!sym->IsVar())
    {
        return;
    }

    BasicBlock * block = this->currentBlock;
    if (this->DoMarkTempNumbers())
    {
        Assert((block->loop != nullptr) == block->tempNumberTracker->HasTempTransferDependencies());
        block->tempNumberTracker->MarkTemp(sym, this);
    }
    if (this->DoMarkTempObjects())
    {
        Assert((block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies());
        block->tempObjectTracker->MarkTemp(sym, this);
    }
#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        Assert((block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies());
        block->tempObjectVerifyTracker->MarkTemp(sym, this);
    }
#endif
}